

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

QStringList * __thiscall QFileDialogPrivate::typedFiles(QFileDialogPrivate *this)

{
  QChar c;
  bool bVar1;
  byte bVar2;
  qsizetype qVar3;
  QFileDialogPrivate *in_RSI;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  int i;
  QFileDialog *q;
  QString prefix_1;
  QString token;
  QStringList tokens;
  QString prefix;
  QString editText;
  QStringList files;
  undefined4 in_stack_fffffffffffffde8;
  CaseSensitivity in_stack_fffffffffffffdec;
  QList<QString> *in_stack_fffffffffffffdf0;
  undefined6 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdfe;
  byte in_stack_fffffffffffffdff;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  int local_1d4;
  undefined1 local_190 [30];
  char16_t local_172;
  QDir local_170 [32];
  undefined1 *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  QChar local_11a;
  QList<QString> local_118 [2];
  QStringBuilder<const_QString_&,_QString_&> local_e8;
  undefined1 local_d8 [30];
  char16_t local_ba;
  QDir local_b8 [32];
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  QChar local_7a;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RSI);
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x755a11);
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  lineEdit((QFileDialogPrivate *)0x755a48);
  QLineEdit::text((QLineEdit *)
                  CONCAT17(in_stack_fffffffffffffdff,
                           CONCAT16(in_stack_fffffffffffffdfe,in_stack_fffffffffffffdf8)));
  QChar::QChar<char16_t,_true>(&local_7a,L'\"');
  c.ucs._1_1_ = in_stack_fffffffffffffdff;
  c.ucs._0_1_ = in_stack_fffffffffffffdfe;
  bVar1 = QString::contains((QString *)in_stack_fffffffffffffdf0,c,in_stack_fffffffffffffdec);
  if (bVar1) {
    local_118[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_118[0].d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_118[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QChar::QChar<char16_t,_true>(&local_11a,L'\"');
    QFlags<Qt::SplitBehaviorFlags>::QFlags
              ((QFlags<Qt::SplitBehaviorFlags> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec
              );
    QString::split((QChar *)local_118,(QFlags_conflict1 *)&local_78,(uint)(ushort)local_11a.ucs);
    for (local_1d4 = 0; qVar3 = QList<QString>::size(local_118), local_1d4 < qVar3;
        local_1d4 = local_1d4 + 1) {
      if (local_1d4 % 2 != 0) {
        local_138 = &DAT_aaaaaaaaaaaaaaaa;
        local_130 = &DAT_aaaaaaaaaaaaaaaa;
        local_128 = &DAT_aaaaaaaaaaaaaaaa;
        QList<QString>::at(in_stack_fffffffffffffdf0,
                           CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
        QString::QString((QString *)in_stack_fffffffffffffdf0,
                         (QString *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
        local_150 = &DAT_aaaaaaaaaaaaaaaa;
        local_148 = &DAT_aaaaaaaaaaaaaaaa;
        local_140 = &DAT_aaaaaaaaaaaaaaaa;
        QFileDialog::directory
                  ((QFileDialog *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
        QDir::absolutePath();
        local_172 = (char16_t)QDir::separator();
        ::operator+((QString *)
                    CONCAT17(in_stack_fffffffffffffdff,
                             CONCAT16(in_stack_fffffffffffffdfe,in_stack_fffffffffffffdf8)),
                    (QChar *)in_stack_fffffffffffffdf0);
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QString,_QChar> *)
                   CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
        QStringBuilder<QString,_QChar>::~QStringBuilder((QStringBuilder<QString,_QChar> *)0x755db8);
        QString::~QString((QString *)0x755dc5);
        QDir::~QDir(local_170);
        ::operator+((QString *)in_stack_fffffffffffffdf0,
                    (QString *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<const_QString_&,_const_QString_&> *)
                   CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
        in_stack_fffffffffffffdff = QFile::exists((QString *)local_190);
        QString::~QString((QString *)0x755e24);
        if ((in_stack_fffffffffffffdff & 1) == 0) {
          qt_tildeExpansion((QString *)in_RSI);
          QList<QString>::operator<<
                    (in_stack_fffffffffffffdf0,
                     (rvalue_ref)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
          QString::~QString((QString *)0x755e73);
        }
        else {
          QList<QString>::operator<<
                    (in_stack_fffffffffffffdf0,
                     (parameter_type)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
        }
        QString::~QString((QString *)0x755e80);
        QString::~QString((QString *)0x755e8d);
      }
    }
    QList<QString>::~QList((QList<QString> *)0x755eaa);
  }
  else {
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    local_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    QFileDialog::directory
              ((QFileDialog *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
    QDir::absolutePath();
    local_ba = (char16_t)QDir::separator();
    ::operator+((QString *)
                CONCAT17(in_stack_fffffffffffffdff,
                         CONCAT16(in_stack_fffffffffffffdfe,in_stack_fffffffffffffdf8)),
                (QChar *)in_stack_fffffffffffffdf0);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QString,_QChar> *)
               CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    QStringBuilder<QString,_QChar>::~QStringBuilder((QStringBuilder<QString,_QChar> *)0x755b2c);
    QString::~QString((QString *)0x755b39);
    QDir::~QDir(local_b8);
    local_e8 = ::operator+((QString *)in_stack_fffffffffffffdf0,
                           (QString *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8))
    ;
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<const_QString_&,_QString_&> *)
               CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    bVar2 = QFile::exists((QString *)local_d8);
    QString::~QString((QString *)0x755b9e);
    if ((bVar2 & 1) == 0) {
      qt_tildeExpansion((QString *)in_RSI);
      QList<QString>::operator<<
                (in_stack_fffffffffffffdf0,
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      QString::~QString((QString *)0x755bf6);
    }
    else {
      QList<QString>::operator<<
                (in_stack_fffffffffffffdf0,
                 (parameter_type)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    }
    QString::~QString((QString *)0x755c03);
  }
  addDefaultSuffixToFiles(in_RSI,in_RDI);
  QString::~QString((QString *)0x755ed3);
  QList<QString>::~QList((QList<QString> *)0x755edd);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QStringList QFileDialogPrivate::typedFiles() const
{
    Q_Q(const QFileDialog);
    QStringList files;
    QString editText = lineEdit()->text();
    if (!editText.contains(u'"')) {
#ifdef Q_OS_UNIX
        const QString prefix = q->directory().absolutePath() + QDir::separator();
        if (QFile::exists(prefix + editText))
            files << editText;
        else
            files << qt_tildeExpansion(editText);
#else
        files << editText;
        Q_UNUSED(q);
#endif
    } else {
        // " is used to separate files like so: "file1" "file2" "file3" ...
        // ### need escape character for filenames with quotes (")
        QStringList tokens = editText.split(u'\"');
        for (int i=0; i<tokens.size(); ++i) {
            if ((i % 2) == 0)
                continue; // Every even token is a separator
#ifdef Q_OS_UNIX
            const QString token = tokens.at(i);
            const QString prefix = q->directory().absolutePath() + QDir::separator();
            if (QFile::exists(prefix + token))
                files << token;
            else
                files << qt_tildeExpansion(token);
#else
            files << toInternal(tokens.at(i));
#endif
        }
    }
    return addDefaultSuffixToFiles(files);
}